

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

FieldGenerator *
google::protobuf::compiler::objectivec::FieldGenerator::Make
          (FieldDescriptor *field,Options *options)

{
  bool bVar1;
  ObjectiveCType OVar2;
  Options *options_00;
  PrimitiveObjFieldGenerator *in_RSI;
  FieldGenerator *result;
  Options *in_stack_000000a0;
  FieldDescriptor *in_stack_000000a8;
  RepeatedMessageFieldGenerator *in_stack_000000b0;
  Options *in_stack_00000150;
  FieldDescriptor *in_stack_00000158;
  RepeatedPrimitiveFieldGenerator *in_stack_00000160;
  Options *in_stack_00000640;
  FieldDescriptor *in_stack_00000648;
  MapFieldGenerator *in_stack_00000650;
  FieldDescriptor *in_stack_ffffffffffffff90;
  Options *in_stack_ffffffffffffffa0;
  FieldDescriptor *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  Options *in_stack_ffffffffffffffe0;
  FieldDescriptor *descriptor;
  
  descriptor = (FieldDescriptor *)0x0;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x5a9451);
  if (bVar1) {
    OVar2 = GetObjectiveCType((FieldDescriptor *)0x5a9464);
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      options_00 = (Options *)operator_new(0x40);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)in_RSI,descriptor,in_stack_ffffffffffffffe0);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(in_stack_ffffffffffffff90);
      if (bVar1) {
        options_00 = (Options *)operator_new(0x48);
        MapFieldGenerator::MapFieldGenerator(in_stack_00000650,in_stack_00000648,in_stack_00000640);
      }
      else {
        options_00 = (Options *)operator_new(0x40);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
      }
    }
    else {
      options_00 = (Options *)operator_new(0x40);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                (in_stack_00000160,in_stack_00000158,in_stack_00000150);
    }
  }
  else {
    OVar2 = GetObjectiveCType((FieldDescriptor *)0x5a95e4);
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      options_00 = (Options *)operator_new(0x40);
      EnumFieldGenerator::EnumFieldGenerator
                ((EnumFieldGenerator *)CONCAT44(OVar2,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,options_00);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      options_00 = (Options *)operator_new(0x40);
      MessageFieldGenerator::MessageFieldGenerator
                ((MessageFieldGenerator *)CONCAT44(OVar2,in_stack_ffffffffffffffb0),
                 (FieldDescriptor *)options_00,in_stack_ffffffffffffffa0);
    }
    else {
      bVar1 = IsReferenceType((FieldDescriptor *)0x5a96ae);
      if (bVar1) {
        options_00 = (Options *)operator_new(0x40);
        PrimitiveObjFieldGenerator::PrimitiveObjFieldGenerator
                  (in_RSI,descriptor,in_stack_ffffffffffffffe0);
      }
      else {
        options_00 = (Options *)operator_new(0x40);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)CONCAT44(OVar2,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      }
    }
  }
  (**(code **)(*(long *)&options_00->expected_prefixes_path + 0x58))();
  return (FieldGenerator *)options_00;
}

Assistant:

FieldGenerator* FieldGenerator::Make(const FieldDescriptor* field,
                                     const Options& options) {
  FieldGenerator* result = NULL;
  if (field->is_repeated()) {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        if (field->is_map()) {
          result = new MapFieldGenerator(field, options);
        } else {
          result = new RepeatedMessageFieldGenerator(field, options);
        }
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new RepeatedEnumFieldGenerator(field, options);
        break;
      default:
        result = new RepeatedPrimitiveFieldGenerator(field, options);
        break;
    }
  } else {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        result = new MessageFieldGenerator(field, options);
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new EnumFieldGenerator(field, options);
        break;
      default:
        if (IsReferenceType(field)) {
          result = new PrimitiveObjFieldGenerator(field, options);
        } else {
          result = new PrimitiveFieldGenerator(field, options);
        }
        break;
    }
  }
  result->FinishInitialization();
  return result;
}